

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O2

fy_token * fy_document_tag_directive_lookup(fy_document *fyd,char *handle)

{
  int iVar1;
  size_t __n;
  fy_token_list *pfVar2;
  char *__s1;
  fy_token *fyt;
  size_t h_size;
  size_t local_30;
  
  if (handle == (char *)0x0 || fyd == (fy_document *)0x0) {
    return (fy_token *)0x0;
  }
  __n = strlen(handle);
  fyt = (fy_token *)0x0;
  do {
    if (fyd->fyds == (fy_document_state *)0x0) {
      return (fy_token *)0x0;
    }
    pfVar2 = &fyd->fyds->fyt_td;
    if (fyt == (fy_token *)0x0) {
      fyt = (fy_token *)pfVar2;
    }
    fyt = (fy_token *)(fyt->node).next;
    if (fyt == (fy_token *)pfVar2) {
      return (fy_token *)0x0;
    }
    if (fyt == (fy_token *)0x0) {
      return (fy_token *)0x0;
    }
    __s1 = fy_tag_directive_token_handle(fyt,&local_30);
  } while (((__s1 == (char *)0x0) || (local_30 != __n)) ||
          (iVar1 = bcmp(__s1,handle,__n), iVar1 != 0));
  return fyt;
}

Assistant:

struct fy_token *fy_document_tag_directive_lookup(struct fy_document *fyd, const char *handle) {
    struct fy_token *fyt;
    void *iter;
    const char *h;
    size_t h_size, len;

    if (!fyd || !handle)
        return NULL;
    len = strlen(handle);

    iter = NULL;
    while ((fyt = fy_document_tag_directive_iterate(fyd, &iter)) != NULL) {
        h = fy_tag_directive_token_handle(fyt, &h_size);
        if (!h)
            continue;
        if (h_size == len && !memcmp(h, handle, len))
            return fyt;
    }
    return NULL;
}